

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileTests.cpp
# Opt level: O2

void __thiscall
solitaire::piles::TableauPileInitializationTest_isSnapshotOfSameObject_Test::
TableauPileInitializationTest_isSnapshotOfSameObject_Test
          (TableauPileInitializationTest_isSnapshotOfSameObject_Test *this)

{
  TableauPileInitializationTest::TableauPileInitializationTest
            (&this->super_TableauPileInitializationTest);
  (this->super_TableauPileInitializationTest).super_TableauPileWithUncoveredTopTwoCardsTest.
  super_InitializedTableauPileTest.super_EmptyTableauPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__TableauPileInitializationTest_002fd3d0;
  return;
}

Assistant:

TEST_F(TableauPileInitializationTest, isSnapshotOfSameObject) {
    const auto snapshot = pile->createSnapshot();
    initializePile(*pile, newPileCards);
    const auto snapshotOfSameObject = pile->createSnapshot();
    const auto snapshotOfSameTypeObject = std::make_shared<TableauPile>()->createSnapshot();
    SnapshotMock snapshotOfDifferentTypeObject;

    EXPECT_TRUE(snapshot->isSnapshotOfSameObject(*snapshotOfSameObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(*snapshotOfSameTypeObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(snapshotOfDifferentTypeObject));
}